

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O1

void __thiscall YAML::detail::node::mark_defined(node *this)

{
  node_data *this_00;
  _Rb_tree_node_base *p_Var1;
  
  this_00 = (((this->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->m_pData).
            super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00->m_isDefined == false) {
    node_data::mark_defined(this_00);
    for (p_Var1 = (this->m_dependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->m_dependencies)._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      mark_defined(*(node **)(p_Var1 + 1));
    }
    std::
    _Rb_tree<YAML::detail::node_*,_YAML::detail::node_*,_std::_Identity<YAML::detail::node_*>,_YAML::detail::node::less,_std::allocator<YAML::detail::node_*>_>
    ::clear(&(this->m_dependencies)._M_t);
    return;
  }
  return;
}

Assistant:

void mark_defined() {
    if (is_defined())
      return;

    m_pRef->mark_defined();
    for (node* dependency : m_dependencies)
      dependency->mark_defined();
    m_dependencies.clear();
  }